

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

bool setOptionInt(MYSQL *mysql,mysql_option option,QStringView v)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  int val;
  bool bOk;
  int local_20;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = true;
  lVar2 = QString::toIntegral_helper(v,&local_19,10);
  iVar1 = (int)lVar2;
  if ((iVar1 == lVar2) && (local_20 = iVar1, (local_19 & 1U) != 0)) {
    iVar1 = mysql_options(mysql,option,&local_20);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool setOptionInt(MYSQL *mysql, mysql_option option, QStringView v)
{
    bool bOk;
    const auto val = v.toInt(&bOk);
    return bOk ? mysql_options(mysql, option, &val) == 0 : false;
}